

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

ON_Object * CreateNewON_V4V5_MeshNgonUserData(void)

{
  ON_V4V5_MeshNgonUserData *this;
  
  this = (ON_V4V5_MeshNgonUserData *)operator_new(0xd8);
  ON_V4V5_MeshNgonUserData::ON_V4V5_MeshNgonUserData(this);
  return (ON_Object *)this;
}

Assistant:

ON_V4V5_MeshNgonUserData::ON_V4V5_MeshNgonUserData()
{
  m_userdata_uuid = ON_CLASS_ID(ON_V4V5_MeshNgonUserData);
  m_application_uuid = ON_opennurbs4_id;
  m_userdata_copycount = 1;
  m_ngon_list = 0;
  m_mesh_F_count = 0;
  m_mesh_V_count = 0;
}